

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O2

ConcreteType * __thiscall
soul::PoolAllocator::
allocate<soul::AST::ConcreteType,soul::AST::Context&,soul::PrimitiveType::Primitive>
          (PoolAllocator *this,Context *args,Primitive *args_1)

{
  PoolItem *pPVar1;
  Type local_30;
  
  pPVar1 = allocateSpaceForObject(this,0x48);
  local_30.primitiveType.type = *args_1;
  local_30.category = local_30.primitiveType.type != invalid;
  local_30.arrayElementCategory = invalid;
  local_30.isRef = false;
  local_30.isConstant = false;
  local_30.boundingSize = 0;
  local_30.arrayElementBoundingSize = 0;
  local_30.structure.object = (Structure *)0x0;
  AST::ConcreteType::ConcreteType((ConcreteType *)&pPVar1->item,args,&local_30);
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_30.structure);
  pPVar1->destructor =
       allocate<soul::AST::ConcreteType,_soul::AST::Context_&,_soul::PrimitiveType::Primitive>::
       anon_class_1_0_00000001::__invoke;
  return (ConcreteType *)&pPVar1->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }